

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O2

void outdoors_echo(AREA_DATA_conflict *area,char *echo)

{
  undefined2 uVar1;
  ROOM_INDEX_DATA *pRVar2;
  bool bVar3;
  DESCRIPTOR_DATA **ppDVar4;
  char buffer [9216];
  char acStack_2428 [9216];
  
  ppDVar4 = &descriptor_list;
  while (ppDVar4 = &((DESCRIPTOR_DATA *)ppDVar4)->next->next,
        (DESCRIPTOR_DATA *)ppDVar4 != (DESCRIPTOR_DATA *)0x0) {
    if ((((DESCRIPTOR_DATA *)ppDVar4)->connected == 0) && (area != (AREA_DATA_conflict *)0x0)) {
      pRVar2 = ((DESCRIPTOR_DATA *)ppDVar4)->character->in_room;
      if ((pRVar2 != (ROOM_INDEX_DATA *)0x0) &&
         ((pRVar2->area == area && (uVar1 = pRVar2->sector_type, 1 < (ushort)(uVar1 - 7))))) {
        bVar3 = is_awake(((DESCRIPTOR_DATA *)ppDVar4)->character);
        if ((bVar3) && ((((DESCRIPTOR_DATA *)ppDVar4)->character->in_room->room_flags[0] & 8) == 0))
        {
          colorconv(acStack_2428,echo,((DESCRIPTOR_DATA *)ppDVar4)->character);
          send_to_char(acStack_2428,((DESCRIPTOR_DATA *)ppDVar4)->character);
          send_to_char("\n\r",((DESCRIPTOR_DATA *)ppDVar4)->character);
        }
      }
    }
  }
  return;
}

Assistant:

void outdoors_echo(AREA_DATA *area, char *echo)
{
	char buffer[MSL * 2];

	for (DESCRIPTOR_DATA *d = descriptor_list; d; d = d->next)
	{
		if (d->connected == CON_PLAYING
			&& d->character->in_room != nullptr
			&& area != nullptr
			&& d->character->in_room->area == area
			&& d->character->in_room->sector_type != SECT_INSIDE
			&& d->character->in_room->sector_type != SECT_UNDERWATER
			&& is_awake(d->character)
			&& !IS_SET(d->character->in_room->room_flags, ROOM_INDOORS))
		{
			colorconv(buffer, echo, d->character);
			send_to_char(buffer, d->character);
			send_to_char("\n\r", d->character);
		}
	}
}